

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Ibcast(void *buffer,int count,MPIABI_Datatype datatype,int root,MPIABI_Comm comm,
                 MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Ibcast();
  return iVar1;
}

Assistant:

int MPIABI_Ibcast(
  void * buffer,
  int count,
  MPIABI_Datatype datatype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Ibcast(
    buffer,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}